

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O0

void init_select_data(CMtrans_services svc,select_data_ptr *sdp,CManager_conflict cm)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  select_data_ptr sd;
  size_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  CMtrans_services svc_00;
  uint local_24;
  
  puVar2 = (undefined8 *)select_malloc(in_stack_ffffffffffffffc0);
  *in_RSI = puVar2;
  uVar3 = (*(code *)*in_RDI)(0x80);
  puVar2[1] = uVar3;
  svc_00 = (CMtrans_services)puVar2[1];
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    (&svc_00->malloc_func)[local_24] = (CMTransport_malloc_func)0x0;
  }
  uVar3 = (*(code *)*in_RDI)(0x80);
  puVar2[2] = uVar3;
  lVar1 = puVar2[2];
  for (uVar4 = 0; uVar4 < 0x10; uVar4 = uVar4 + 1) {
    *(undefined8 *)(lVar1 + (ulong)uVar4 * 8) = 0;
  }
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 7) = 0;
  *(undefined4 *)(puVar2 + 3) = 0;
  uVar3 = (*(code *)*in_RDI)(0x18);
  puVar2[4] = uVar3;
  *(undefined8 *)puVar2[4] = 0;
  *(undefined8 *)(puVar2[4] + 8) = 0;
  *(undefined8 *)(puVar2[4] + 0x10) = 0;
  uVar3 = (*(code *)*in_RDI)(0x18);
  puVar2[5] = uVar3;
  *(undefined8 *)puVar2[5] = 0;
  *(undefined8 *)(puVar2[5] + 8) = 0;
  *(undefined8 *)(puVar2[5] + 0x10) = 0;
  puVar2[6] = 0;
  *(undefined4 *)(puVar2 + 9) = 0;
  *(undefined4 *)((long)puVar2 + 0x4c) = 0xffffffff;
  *(undefined4 *)(puVar2 + 10) = 0xffffffff;
  if (in_RDX != 0) {
    puVar2[8] = in_RDX;
  }
  setup_wake_mechanism(svc_00,(select_data_ptr *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

static void
init_select_data(CMtrans_services svc, select_data_ptr *sdp, CManager cm)
{
    select_data_ptr sd = malloc(sizeof(struct select_data));
    *sdp = sd;
    sd->fdset = svc->malloc_func(sizeof(fd_set));
    EVPATH_FD_ZERO((fd_set *) sd->fdset);
    sd->write_set = svc->malloc_func(sizeof(fd_set));
    EVPATH_FD_ZERO((fd_set *) sd->write_set);
    sd->server_thread =  (thr_thread_id)(intptr_t) NULL;
    sd->closed = 0;
    sd->sel_item_max = 0;
    sd->select_items = (FunctionListElement *) svc->malloc_func(sizeof(FunctionListElement));
    sd->select_items[0].func = NULL;
    sd->select_items[0].arg1 = NULL;
    sd->select_items[0].arg2 = NULL;
    sd->write_items = (FunctionListElement *) svc->malloc_func(sizeof(FunctionListElement));
    sd->write_items[0].func = NULL;
    sd->write_items[0].arg1 = NULL;
    sd->write_items[0].arg2 = NULL;
    
    sd->periodic_task_list = NULL;
    sd->select_consistency_number = 0;
    sd->wake_read_fd = -1;
    sd->wake_write_fd = -1;
    if (cm != NULL) {
	sd->cm = cm;
    }
    setup_wake_mechanism(svc, sdp);
}